

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HopcroftKarpAlgorithm.cpp
# Opt level: O1

bool __thiscall BoxNesting::HopcroftKarpAlgorithm::dfs(HopcroftKarpAlgorithm *this,int16_t vertex)

{
  short sVar1;
  short vertex_00;
  pointer pvVar2;
  short *psVar3;
  pointer psVar4;
  bool bVar5;
  short *psVar6;
  bool bVar7;
  
  bVar7 = true;
  if (vertex != 0) {
    pvVar2 = (this->graph).
             super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = *(pointer *)
              ((long)&pvVar2[vertex].super__Vector_base<short,_std::allocator<short>_>._M_impl + 8);
    for (psVar6 = *(short **)
                   &pvVar2[vertex].super__Vector_base<short,_std::allocator<short>_>._M_impl;
        bVar7 = psVar6 != psVar3, bVar7; psVar6 = psVar6 + 1) {
      sVar1 = *psVar6;
      psVar4 = (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_start;
      vertex_00 = (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar1];
      if ((psVar4[vertex] + 1 == (int)psVar4[vertex_00]) && (bVar5 = dfs(this,vertex_00), bVar5)) {
        (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
        super__Vector_impl_data._M_start[sVar1] = vertex;
        (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
        super__Vector_impl_data._M_start[vertex] = sVar1;
        if (bVar7) {
          return true;
        }
        break;
      }
    }
    (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
    super__Vector_impl_data._M_start[vertex] = 0x7fff;
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool HopcroftKarpAlgorithm::dfs(int16_t vertex) const
{
	// Path ends if it visits the NILL vertex
	// because we can't traverse anywhere from it
	// It is a shorter path because we we are allready
	// iterating through shorter paths.
	if (vertex == NILL)
	{
		return true;
	}

	for (auto j : this->graph[vertex])
	{ 
		// Follow the distances set by BFS 
		if (this->distances[this->pairsRight[j]] == this->distances[vertex] + 1) 
		{ 
			// If dfs for pair of v also returns 
			// true then it means the path ends at a
			// NILL which means it is the shortest math
			if (dfs(this->pairsRight[j])) 
			{
				// At the matching
				this->pairsRight[j] = vertex;
				this->pairsLeft[vertex] = j;
				return true; 
			} 
		} 
	} 

	// We set distance to infinite here so we can ensure it will
	// not be used in a future path. We allready know this is not
	// the shortest path so it doesn't make sense to check this vertex
	// again.
	this->distances[vertex] = INF; 
	// No paths where found to NILL so it isn't
	// the shortest path
	return false; 
}